

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_36_c.c
# Opt level: O0

char * decode_pure(int *digits_values,uint digits_size,char *s,uint s_size,int *result)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  uint local_50;
  int local_4c;
  uint i;
  int value;
  int have_non_blank;
  int have_minus;
  int dv;
  int si;
  int *result_local;
  uint s_size_local;
  char *s_local;
  uint digits_size_local;
  int *digits_values_local;
  
  bVar2 = false;
  bVar3 = false;
  local_4c = 0;
  local_50 = 0;
  while( true ) {
    if (s_size <= local_50) {
      if (bVar2) {
        local_4c = -local_4c;
      }
      *result = local_4c;
      return (char *)0x0;
    }
    iVar4 = (int)s[local_50];
    if ((iVar4 < 0) || (0x7f < iVar4)) break;
    if (iVar4 == 0x20) {
      if (bVar3) {
        local_4c = digits_size * local_4c;
      }
    }
    else if (iVar4 == 0x2d) {
      if (bVar3) {
        *result = 0;
        pcVar5 = invalid_number_literal();
        return pcVar5;
      }
      bVar3 = true;
      bVar2 = true;
    }
    else {
      bVar3 = true;
      uVar1 = digits_values[iVar4];
      if (((int)uVar1 < 0) || (digits_size <= uVar1)) {
        *result = 0;
        pcVar5 = invalid_number_literal();
        return pcVar5;
      }
      local_4c = uVar1 + digits_size * local_4c;
    }
    local_50 = local_50 + 1;
  }
  *result = 0;
  pcVar5 = invalid_number_literal();
  return pcVar5;
}

Assistant:

static
const char*
decode_pure(
  const int* digits_values,
  unsigned digits_size,
  const char* s,
  unsigned s_size,
  int* result)
{
  int si, dv;
  int have_minus = 0;
  int have_non_blank = 0;
  int value = 0;
  unsigned i = 0;
  for(;i<s_size;i++) {
    si = s[i];
    if (si < 0 || si > 127) {
      *result = 0;
      return invalid_number_literal();
    }
    if (si == ' ') {
      if (!have_non_blank) continue;
      value *= digits_size;
    }
    else if (si == '-') {
      if (have_non_blank) {
        *result = 0;
        return invalid_number_literal();
      }
      have_non_blank = 1;
      have_minus = 1;
      continue;
    }
    else {
      have_non_blank = 1;
      dv = digits_values[si];
      if (dv < 0 || dv >= digits_size) {
        *result = 0;
        return invalid_number_literal();
      }
      value *= digits_size;
      value += dv;
    }
  }
  if (have_minus) value = -value;
  *result = value;
  return 0;
}